

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

MessageLite *
google::protobuf::internal::TcParser::AddMessage
          (TcParseTableBase *table,RepeatedPtrFieldBase *field)

{
  int iVar1;
  Arena *arena;
  bool bVar2;
  void **ppvVar3;
  MessageLite *pMVar4;
  Rep *pRVar5;
  int __old_val;
  
  pMVar4 = (MessageLite *)field->tagged_rep_or_elem_;
  arena = field->arena_;
  if (pMVar4 == (MessageLite *)0x0) {
    field->current_size_ = 1;
    pMVar4 = ClassData::New(table->class_data,arena);
    field->tagged_rep_or_elem_ = pMVar4;
  }
  else if (((ulong)pMVar4 & 1) == 0) {
    if (field->current_size_ == 0) {
      field->current_size_ = 1;
    }
    else {
      ppvVar3 = RepeatedPtrFieldBase::InternalExtend(field,1);
      pMVar4 = ClassData::New(table->class_data,arena);
      *ppvVar3 = pMVar4;
      pRVar5 = RepeatedPtrFieldBase::rep(field);
      pRVar5->allocated_size = 2;
      field->current_size_ = 2;
      pMVar4 = (MessageLite *)*ppvVar3;
    }
  }
  else {
    pRVar5 = RepeatedPtrFieldBase::rep(field);
    bVar2 = RepeatedPtrFieldBase::SizeAtCapacity(field);
    if (bVar2) {
      RepeatedPtrFieldBase::InternalExtend(field,1);
      pRVar5 = RepeatedPtrFieldBase::rep(field);
    }
    else {
      iVar1 = field->current_size_;
      if (iVar1 != pRVar5->allocated_size) {
        field->current_size_ = iVar1 + 1;
        return (MessageLite *)pRVar5->elements[iVar1];
      }
    }
    pRVar5->allocated_size = pRVar5->allocated_size + 1;
    iVar1 = field->current_size_;
    field->current_size_ = iVar1 + 1;
    pMVar4 = ClassData::New(table->class_data,arena);
    pRVar5->elements[iVar1] = pMVar4;
  }
  return pMVar4;
}

Assistant:

MessageLite* TcParser::AddMessage(const TcParseTableBase* table,
                                  RepeatedPtrFieldBase& field) {
  return static_cast<MessageLite*>(field.AddInternal(
      [table](Arena* arena) { return NewMessage(table, arena); }));
}